

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O2

bool duckdb::
     IntegerHexCastLoop<duckdb::DecimalCastData<int>,false,false,duckdb::DecimalCastOperation>
               (char *buf,idx_t len,DecimalCastData<int> *result,bool strict)

{
  byte bVar1;
  bool bVar2;
  byte c;
  
  if (len < 2) {
    DecimalCastOperation::Finalize<duckdb::DecimalCastData<int>,false>(result);
  }
  else {
    bVar1 = buf[1];
    c = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      c = bVar1;
    }
    bVar2 = StringUtil::CharacterIsHex(c);
    if ((((len != 2) && (bVar2)) && (len != 3)) && (buf[2] == '_')) {
      StringUtil::CharacterIsHex(buf[3]);
    }
  }
  return false;
}

Assistant:

static bool IntegerHexCastLoop(const char *buf, idx_t len, T &result, bool strict) {
	if (ALLOW_EXPONENT || NEGATIVE) {
		return false;
	}
	idx_t start_pos = 1;
	idx_t pos = start_pos;
	char current_char;
	while (pos < len) {
		current_char = StringUtil::CharacterToLower(buf[pos]);
		if (!StringUtil::CharacterIsHex(current_char)) {
			return false;
		}
		uint8_t digit;
		if (current_char >= 'a') {
			digit = UnsafeNumericCast<uint8_t>(current_char - 'a' + 10);
		} else {
			digit = UnsafeNumericCast<uint8_t>(current_char - '0');
		}
		pos++;

		if (pos != len && buf[pos] == '_') {
			// Skip one underscore if it is not the last character and followed by a hex
			pos++;
			if (pos == len || !StringUtil::CharacterIsHex(buf[pos])) {
				return false;
			}
		}

		if (!OP::template HandleHexDigit<T, NEGATIVE>(result, digit)) {
			return false;
		}
	}
	if (!OP::template Finalize<T, NEGATIVE>(result)) {
		return false;
	}
	return pos > start_pos;
}